

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

string * (anonymous_namespace)::NumberToStr_abi_cxx11_(Value *num)

{
  double *in_RSI;
  string *in_RDI;
  double dVar1;
  char temp [64];
  allocator local_59;
  char local_58 [72];
  double *local_10;
  
  if (*(int *)(in_RSI + 1) == 2) {
    local_10 = in_RSI;
    dVar1 = floor(*in_RSI);
    if ((dVar1 != *local_10) || (NAN(dVar1) || NAN(*local_10))) {
      snprintf(local_58,0x40,"%g",*local_10);
    }
    else {
      snprintf(local_58,0x40,"%lld",(long)*local_10);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,local_58,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    return in_RDI;
  }
  __assert_fail("num->type_ == luna::ValueT_Number",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",0xe,
                "std::string (anonymous namespace)::NumberToStr(luna::Value *)");
}

Assistant:

std::string NumberToStr(luna::Value *num)
    {
        assert(num->type_ == luna::ValueT_Number);
        char temp[64];
        if (floor(num->num_) == num->num_)
            snprintf(temp, sizeof(temp), "%lld", static_cast<long long>(num->num_));
        else
            snprintf(temp, sizeof(temp), "%g", num->num_);
        return temp;
    }